

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to4_int8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  undefined1 auVar17 [16];
  int *piVar18;
  int iVar19;
  void *pvVar20;
  ulong uVar21;
  long lVar22;
  undefined2 *puVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  void *pvVar28;
  long lVar29;
  uint *puVar30;
  long lVar31;
  undefined4 uVar32;
  undefined2 *puVar33;
  undefined2 *puVar34;
  undefined2 *puVar35;
  short tmp [6] [3];
  ulong local_110;
  void *local_d8;
  undefined1 local_a8 [64];
  size_t local_68;
  short asStack_5c [3];
  uint auStack_56 [9];
  
  iVar19 = cpu_support_x86_avx2();
  if (iVar19 != 0) {
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2
              (kernel,kernel_tm_pack8,inch,outch,opt);
    return;
  }
  iVar19 = cpu_support_x86_xop();
  if (iVar19 != 0) {
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
              (kernel,kernel_tm_pack8,inch,outch,opt);
    return;
  }
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_a8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar14 = kernel->data;
    local_d8 = (void *)local_a8._0_8_;
    local_110 = 0;
    do {
      if (0 < inch) {
        iVar19 = inch * 9 * (int)local_110;
        uVar21 = 0;
        pvVar28 = local_d8;
        do {
          lVar25 = uVar21 * 9;
          cVar1 = *(char *)((long)pvVar14 + lVar25 + iVar19);
          cVar2 = *(char *)((long)pvVar14 + lVar25 + (long)iVar19 + 1);
          cVar3 = *(char *)((long)pvVar14 + lVar25 + (long)iVar19 + 2);
          cVar4 = *(char *)((long)pvVar14 + lVar25 + (long)iVar19 + 3);
          cVar5 = *(char *)((long)pvVar14 + lVar25 + (long)iVar19 + 4);
          cVar6 = *(char *)((long)pvVar14 + lVar25 + (long)iVar19 + 5);
          cVar7 = *(char *)((long)pvVar14 + lVar25 + (long)iVar19 + 6);
          cVar8 = *(char *)((long)pvVar14 + lVar25 + (long)iVar19 + 7);
          cVar9 = *(char *)((long)pvVar14 + lVar25 + (long)iVar19 + 8);
          lVar25 = 4;
          do {
            sVar10 = *(short *)(&UNK_00556c8c + lVar25);
            sVar11 = *(short *)(&UNK_00556c8e + lVar25);
            sVar12 = *(short *)((long)&DAT_00556c90 + lVar25);
            *(short *)((long)asStack_5c + lVar25) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1
            ;
            *(short *)((long)asStack_5c + lVar25 + 2) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar25 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar25 = lVar25 + 6;
          } while (lVar25 != 0x28);
          lVar25 = 0;
          pvVar20 = pvVar28;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar25 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar25 * 6);
            puVar30 = &DAT_00556c92;
            lVar31 = 0;
            do {
              auVar17 = vpmullw_avx(ZEXT416(*puVar30),ZEXT416(uVar13));
              uVar32 = vpextrw_avx(auVar17,1);
              *(short *)((long)pvVar20 + lVar31 * 2) =
                   (short)uVar32 + auVar17._0_2_ + *(short *)((long)puVar30 + -2) * sVar10;
              lVar31 = lVar31 + 1;
              puVar30 = (uint *)((long)puVar30 + 6);
            } while (lVar31 != 6);
            lVar25 = lVar25 + 1;
            pvVar20 = (void *)((long)pvVar20 + 0xc);
          } while (lVar25 != 6);
          uVar21 = uVar21 + 1;
          pvVar28 = (void *)((long)pvVar28 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
        } while (uVar21 != (uint)inch);
      }
      local_110 = local_110 + 1;
      local_d8 = (void *)((long)local_d8 + local_68 * local_a8._16_8_);
    } while (local_110 != (uint)outch);
  }
  iVar19 = inch + 7;
  if (-1 < inch) {
    iVar19 = inch;
  }
  iVar24 = outch + 3;
  if (-1 < outch) {
    iVar24 = outch;
  }
  Mat::create(kernel_tm_pack8,iVar19 >> 3,0x24,iVar24 >> 2,0x40,0x20,(Allocator *)0x0);
  if (3 < outch) {
    iVar19 = kernel_tm_pack8->w;
    pvVar14 = kernel_tm_pack8->data;
    sVar15 = kernel_tm_pack8->elemsize;
    sVar16 = kernel_tm_pack8->cstep;
    uVar21 = 0;
    do {
      puVar33 = (undefined2 *)(local_68 * local_a8._16_8_ * uVar21 + local_a8._0_8_);
      lVar25 = 0;
      do {
        if (7 < inch) {
          lVar31 = (long)pvVar14 + (long)iVar19 * sVar15 * lVar25 + (uVar21 >> 2) * sVar16 * sVar15;
          lVar29 = 0;
          puVar34 = puVar33;
          do {
            lVar26 = 0;
            puVar35 = puVar34;
            do {
              lVar22 = lVar31;
              lVar31 = 0;
              puVar23 = puVar35;
              do {
                *(undefined2 *)(lVar22 + lVar31) = *puVar23;
                puVar23 = (undefined2 *)
                          ((long)puVar23 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
                lVar31 = lVar31 + 2;
              } while (lVar31 != 0x10);
              lVar26 = lVar26 + 1;
              puVar35 = (undefined2 *)((long)puVar35 + local_68 * local_a8._16_8_);
              lVar31 = lVar22 + 0x10;
            } while (lVar26 != 4);
            lVar26 = lVar29 + 0xf;
            puVar34 = puVar34 + (long)(int)local_a8._44_4_ * local_a8._16_8_ * 4;
            lVar31 = lVar22 + 0x10;
            lVar29 = lVar29 + 8;
          } while (lVar26 < inch);
        }
        lVar25 = lVar25 + 1;
        puVar33 = puVar33 + 1;
      } while (lVar25 != 0x24);
      uVar27 = uVar21 + 7;
      uVar21 = uVar21 + 4;
    } while (uVar27 < (uint)outch);
  }
  piVar18 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_a8._0_8_ != (void *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx512vnni(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avxvnni(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif
#endif

    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch, (size_t)2u);

    const short ktm[6][3] = {
        {6, 0, 0},
        {-4, -4, -4},
        {-4, 4, -4},
        {1, 2, 4},
        {1, -2, 4},
        {0, 0, 6}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 4b-8a-inch/8a-36-outch/4b
    kernel_tm_pack8.create(inch / 8, 36, outch / 4, (size_t)2u * 32, 32);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm_pack8.channel(q / 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const short* k00 = kernel_tm.channel(q + i).row<const short>(p + j);
                        g00[0] = k00[k];
                        g00 += 1;
                    }
                }
            }
        }
    }
}